

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::TryCastDecimalToNumeric<int,_duckdb::hugeint_t>
               (int input,hugeint_t *result,CastParameters *parameters,uint8_t scale)

{
  bool bVar1;
  byte in_CL;
  int in_EDI;
  string error;
  int64_t scaled_value;
  int64_t rounding;
  int64_t fNegate;
  int64_t power;
  hugeint_t *in_stack_ffffffffffffff58;
  CastParameters *parameters_00;
  undefined8 in_stack_ffffffffffffff60;
  int32_t input_00;
  string *error_message;
  string *in_stack_ffffffffffffff68;
  undefined1 auStack_81 [33];
  string asStack_60 [32];
  CastParameters *pCStack_40;
  long lStack_38;
  ulong uStack_30;
  ulong uStack_28;
  byte bStack_1;
  
  input_00 = (int32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  uStack_28 = *(ulong *)(NumericHelper::POWERS_OF_TEN + (ulong)in_CL * 8);
  uStack_30 = (ulong)(in_EDI < 0);
  lStack_38 = (long)((uStack_28 ^ -uStack_30) + uStack_30) / 2;
  pCStack_40 = (CastParameters *)((in_EDI + lStack_38) / (long)uStack_28);
  UnsafeNumericCast<int,_long,_void>((long)pCStack_40);
  bVar1 = TryCast::Operation<int,_duckdb::hugeint_t>(input_00,in_stack_ffffffffffffff58,false);
  if (bVar1) {
    bStack_1 = 1;
  }
  else {
    error_message = (string *)auStack_81;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(auStack_81 + 1),"Failed to cast decimal value %d to type %s",
               (allocator *)error_message);
    parameters_00 = pCStack_40;
    GetTypeId<duckdb::hugeint_t>();
    StringUtil::Format<long,_duckdb::PhysicalType>
              (in_stack_ffffffffffffff68,(long)error_message,
               (PhysicalType)((ulong)parameters_00 >> 0x38));
    ::std::__cxx11::string::~string((string *)(auStack_81 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)auStack_81);
    HandleCastError::AssignError(error_message,parameters_00);
    bStack_1 = 0;
    ::std::__cxx11::string::~string(asStack_60);
  }
  return (bool)(bStack_1 & 1);
}

Assistant:

bool TryCastDecimalToNumeric(SRC input, DST &result, CastParameters &parameters, uint8_t scale) {
	// Round away from 0.
	const auto power = NumericHelper::POWERS_OF_TEN[scale];
	// https://graphics.stanford.edu/~seander/bithacks.html#ConditionalNegate
	const auto fNegate = int64_t(input < 0);
	const auto rounding = ((power ^ -fNegate) + fNegate) / 2;
	const auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<SRC, DST>(UnsafeNumericCast<SRC>(scaled_value), result)) {
		string error = StringUtil::Format("Failed to cast decimal value %d to type %s", scaled_value, GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}